

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QCalendarWidgetPrivate::QCalendarWidgetPrivate(QCalendarWidgetPrivate *this)

{
  QWidgetPrivate::QWidgetPrivate(&this->super_QWidgetPrivate,QObjectPrivateVersion);
  *(undefined ***)&this->super_QWidgetPrivate = &PTR__QCalendarWidgetPrivate_007fd400;
  (this->monthToAction).d.d.ptr =
       (QMapData<std::map<int,_QAction_*,_std::less<int>,_std::allocator<std::pair<const_int,_QAction_*>_>_>_>
        *)0x0;
  (this->cachedSizeHint).wd = -1;
  (this->cachedSizeHint).ht = -1;
  this->m_model = (QCalendarModel *)0x0;
  this->m_view = (QCalendarView *)0x0;
  this->m_delegate = (QCalendarDelegate *)0x0;
  this->m_selection = (QItemSelectionModel *)0x0;
  *(undefined8 *)((long)&this->m_selection + 1) = 0;
  *(undefined8 *)((long)&this->m_navigator + 1) = 0;
  this->navBarVisible = true;
  this->oldFocusPolicy = StrongFocus;
  return;
}

Assistant:

QCalendarWidgetPrivate::QCalendarWidgetPrivate()
    : QWidgetPrivate()
{
    m_model = nullptr;
    m_view = nullptr;
    m_delegate = nullptr;
    m_selection = nullptr;
    m_navigator = nullptr;
    m_dateEditEnabled = false;
    navBarVisible = true;
    oldFocusPolicy = Qt::StrongFocus;
}